

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minReLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,int leave,
            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,bool polish)

{
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar1;
  type_conflict5 tVar2;
  Status SVar3;
  undefined8 uVar4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *to;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  pointer pnVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<100U,_int,_void> local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  if (leave < 0) goto LAB_0037aa90;
  pSVar5 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar1 = pSVar5->theFvec;
  tVar2 = boost::multiprecision::operator>
                    ((pSVar5->theUBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (uint)leave,
                     (pSVar5->theLBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (uint)leave);
  if (tVar2) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[](&local_1c8,&pUVar1->thedelta,leave);
    local_218.fpclass = cpp_dec_float_finite;
    local_218.prec_elem = 0x10;
    local_218.data._M_elems[0] = 0;
    local_218.data._M_elems[1] = 0;
    local_218.data._M_elems[2] = 0;
    local_218.data._M_elems[3] = 0;
    local_218.data._M_elems[4] = 0;
    local_218.data._M_elems[5] = 0;
    local_218.data._M_elems[6] = 0;
    local_218.data._M_elems[7] = 0;
    local_218.data._M_elems[8] = 0;
    local_218.data._M_elems[9] = 0;
    local_218.data._M_elems[10] = 0;
    local_218.data._M_elems[0xb] = 0;
    local_218.data._M_elems[0xc] = 0;
    local_218.data._M_elems[0xd] = 0;
    local_218.data._M_elems._56_5_ = 0;
    local_218.data._M_elems[0xf]._1_3_ = 0;
    local_218.exp = 0;
    local_218.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_218,&(this->fastDelta).m_backend,&maxabs->m_backend);
    tVar2 = boost::multiprecision::operator>
                      (sel,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_218);
    if (!tVar2) goto LAB_0037aa90;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)sel,0.0);
    if (polish) goto LAB_0037aa90;
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    SVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dualStatus(&pSVar5->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ,(pSVar5->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).theBaseId.data + (uint)leave);
    if (SVar3 == D_ON_BOTH) goto LAB_0037aa90;
    local_218.data._M_elems[0] = 0;
    local_218.data._M_elems[1] = 0;
    tVar2 = boost::multiprecision::operator>(&local_1c8,(double *)&local_218);
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar6 = (pUVar1->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start + (uint)leave;
    if (tVar2) {
      local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6->m_backend;
      local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 8);
      local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x10);
      local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x18);
      local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x20);
      local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x28);
      local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x30);
      local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x38);
      local_88.m_backend.exp = *(int *)((long)&pnVar6->m_backend + 0x40);
      local_88.m_backend.neg = *(bool *)((long)&pnVar6->m_backend + 0x44);
      local_88.m_backend._72_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x48);
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::shiftLBbound(pSVar5,leave,&local_88);
      goto LAB_0037aa90;
    }
    local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6->m_backend;
    local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 8);
    local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x10);
    local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x18);
    local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x20);
    local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x28);
    local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x30);
    local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((long)&pnVar6->m_backend + 0x38);
    to = &local_d8;
    local_d8.m_backend.exp = *(int *)((long)&pnVar6->m_backend + 0x40);
    local_d8.m_backend.neg = *(bool *)((long)&pnVar6->m_backend + 0x44);
    uVar4 = *(undefined8 *)((long)&pnVar6->m_backend + 0x48);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)sel,0.0);
    if (polish) goto LAB_0037aa90;
    pnVar6 = (pUVar1->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[(uint)leave].m_backend;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar6[(uint)leave].m_backend + 8);
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x10);
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x18);
    local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x20);
    local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x28);
    local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x30);
    local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x38);
    local_128.m_backend.exp = *(int *)((long)(pnVar6 + (uint)leave) + 0x40);
    local_128.m_backend.neg = *(bool *)((long)(pnVar6 + (uint)leave) + 0x44);
    local_128.m_backend._72_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x48);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftLBbound((this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver,leave,&local_128);
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar6 = (pUVar1->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[(uint)leave].m_backend;
    local_178.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar6[(uint)leave].m_backend + 8);
    local_178.m_backend.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x10);
    local_178.m_backend.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x18);
    local_178.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x20);
    local_178.m_backend.data._M_elems._40_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x28);
    local_178.m_backend.data._M_elems._48_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x30);
    local_178.m_backend.data._M_elems._56_8_ = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x38);
    to = &local_178;
    local_178.m_backend.exp = *(int *)((long)(pnVar6 + (uint)leave) + 0x40);
    local_178.m_backend.neg = *(bool *)((long)(pnVar6 + (uint)leave) + 0x44);
    uVar4 = *(undefined8 *)((long)(pnVar6 + (uint)leave) + 0x48);
  }
  (to->m_backend).fpclass = (int)uVar4;
  (to->m_backend).prec_elem = (int)((ulong)uVar4 >> 0x20);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::shiftUBbound(pSVar5,leave,to);
LAB_0037aa90:
  return SUB41((uint)leave >> 0x1f,0);
}

Assistant:

bool SPxFastRT<R>::minReLeave(R& sel, int leave, R maxabs, bool polish)
{
   UpdateVector<R>& vec = this->thesolver->fVec();
   VectorBase<R>& low = this->thesolver->lbBound();
   VectorBase<R>& up = this->thesolver->ubBound();

   if(leave < 0)
      return true;

   if(up[leave] > low[leave])
   {
      R x = vec.delta()[leave];

      if(sel > fastDelta / maxabs)
      {
         sel = 0.0;

         if(!polish
               && this->thesolver->dualStatus(this->thesolver->baseId(leave)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
            // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         {
            if(x > 0.0)
               this->thesolver->shiftLBbound(leave, vec[leave]);
            else
               this->thesolver->shiftUBbound(leave, vec[leave]);
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         this->thesolver->shiftLBbound(leave, vec[leave]);
         this->thesolver->shiftUBbound(leave, vec[leave]);
      }
   }

   return false;
}